

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

size_t __thiscall
google::protobuf::compiler::CodeGeneratorRequest::ByteSizeLong(CodeGeneratorRequest *this)

{
  uint uVar1;
  UnknownFieldSet *unknown_fields;
  Type *value;
  size_t sVar2;
  Type *value_00;
  size_t sVar3;
  uint i;
  uint uVar4;
  long lVar5;
  uint index;
  
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar2 = 0;
  }
  else {
    unknown_fields = CodeGeneratorRequest::unknown_fields(this);
    sVar2 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar1 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  lVar5 = sVar2 + uVar1;
  uVar4 = 0;
  index = 0;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
    index = 0;
  }
  for (; uVar4 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                      (&(this->file_to_generate_).super_RepeatedPtrFieldBase,index);
    sVar2 = internal::WireFormatLite::StringSize(value);
    lVar5 = lVar5 + sVar2;
  }
  uVar1 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
  sVar2 = lVar5 + (ulong)uVar1;
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    value_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                         (&(this->proto_file_).super_RepeatedPtrFieldBase,uVar4);
    sVar3 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FileDescriptorProto>
                      (value_00);
    sVar2 = sVar2 + sVar3;
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->parameter_).ptr_);
      sVar2 = sVar2 + sVar3 + 1;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      sVar3 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::compiler::Version>
                        (this->compiler_version_);
      sVar2 = sVar2 + sVar3 + 1;
    }
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t CodeGeneratorRequest::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorRequest)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated string file_to_generate = 1;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->file_to_generate_size());
  for (int i = 0, n = this->file_to_generate_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->file_to_generate(i));
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  {
    unsigned int count = this->proto_file_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->proto_file(i));
    }
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional string parameter = 2;
    if (has_parameter()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->parameter());
    }

    // optional .google.protobuf.compiler.Version compiler_version = 3;
    if (has_compiler_version()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->compiler_version_);
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}